

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedTools.c
# Opt level: O3

void writeFileToFile(FILE *inFile,FILE *outFile)

{
  int iVar1;
  void *__ptr;
  size_t __n;
  
  __ptr = malloc(0x400);
  while( true ) {
    iVar1 = feof((FILE *)inFile);
    if (iVar1 != 0) break;
    __n = fread(__ptr,1,0x400,(FILE *)inFile);
    fwrite(__ptr,1,__n,(FILE *)outFile);
  }
  free(__ptr);
  return;
}

Assistant:

void writeFileToFile(FILE * inFile, FILE * outFile) {
	uint8_t * binary_buffer = malloc(sizeof(uint8_t)*CHARLENGTH);
	
	while (!feof(inFile)) {
		ssize_t n = fread(binary_buffer, sizeof(uint8_t), CHARLENGTH, inFile);
		fwrite(binary_buffer, sizeof(uint8_t), n, outFile);
	}
	
	free(binary_buffer);
}